

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BasicTexImageCubeCase::createTexture(BasicTexImageCubeCase *this)

{
  ContextWrapper *this_00;
  uint uVar1;
  deUint32 format;
  deUint32 type;
  uint uVar2;
  deUint32 dVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int local_f0;
  deUint32 tex;
  int local_e8;
  int local_e4;
  ulong local_e0;
  long local_d8;
  ContextWrapper *local_d0;
  TextureFormat fmt;
  Random rnd;
  TextureLevel levelData;
  Vec4 gMin;
  Vector<float,_4> local_78;
  Vec4 gMax;
  PixelBufferAccess local_58;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_f0 = 1;
  }
  else {
    uVar1 = (this->super_TextureSpecCase).m_width;
    uVar2 = 0x20;
    uVar6 = uVar2;
    if (uVar1 != 0) {
      uVar6 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = uVar6 ^ 0x1f;
    }
    uVar1 = (this->super_TextureSpecCase).m_height;
    if (uVar1 != 0) {
      uVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    local_f0 = 0x1f - uVar2;
    if ((int)(0x1f - uVar2) < (int)(0x1f - uVar6)) {
      local_f0 = 0x1f - uVar6;
    }
    local_f0 = local_f0 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  dVar3 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  uVar5 = 0;
  local_d0 = this_00;
  while ((int)uVar5 != local_f0) {
    local_e4 = (this->super_TextureSpecCase).m_width >> ((byte)uVar5 & 0x1f);
    if (local_e4 < 2) {
      local_e4 = 1;
    }
    local_e8 = (this->super_TextureSpecCase).m_height >> ((byte)uVar5 & 0x1f);
    if (local_e8 < 2) {
      local_e8 = 1;
    }
    local_e0 = uVar5;
    tcu::TextureLevel::setSize(&levelData,local_e4,local_e8,1);
    lVar4 = 0;
    while( true ) {
      if (lVar4 == 0x18) break;
      local_d8 = lVar4;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gMax,1.0);
      randomVector<4>((Functional *)&gMin,&rnd,(Vector<float,_4> *)&local_58,
                      (Vector<float,_4> *)&gMax);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
      tcu::Vector<float,_4>::Vector(&local_78,1.0);
      randomVector<4>((Functional *)&gMax,&rnd,(Vector<float,_4> *)&local_58,&local_78);
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      dVar3 = *(deUint32 *)((long)&s_cubeMapFaces + local_d8);
      format = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      sglr::ContextWrapper::glTexImage2D
                (local_d0,dVar3,(int)local_e0,format,local_e4,local_e8,0,format,type,
                 local_58.super_ConstPixelBufferAccess.m_data);
      lVar4 = local_d8 + 4;
    }
    uVar5 = (ulong)((int)local_e0 + 1);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			levelData.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd);
				Vec4 gMax = randomVector<4>(rnd);

				tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
			}
		}
	}